

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void send_authorization_request(mg_connection *conn,char *realm)

{
  long lVar1;
  unsigned_long uVar2;
  ulong uVar3;
  char local_a8 [8];
  char buf [128];
  int trunc;
  uint64_t nonce;
  char *realm_local;
  mg_connection *conn_local;
  
  lVar1 = conn->phys_ctx->start_time;
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  nonce = (uint64_t)realm;
  if (realm == (char *)0x0) {
    nonce = (uint64_t)conn->dom_ctx->config[0x1e];
  }
  mg_lock_context(conn->phys_ctx);
  uVar2 = conn->dom_ctx->nonce_count;
  conn->dom_ctx->nonce_count = conn->dom_ctx->nonce_count + 1;
  mg_unlock_context(conn->phys_ctx);
  uVar3 = conn->dom_ctx->auth_nonce_mask;
  conn->must_close = 1;
  mg_response_header_start(conn,0x191);
  send_no_cache_header(conn);
  send_additional_header(conn);
  mg_response_header_add(conn,"Content-Length","0",-1);
  mg_snprintf(conn,(int *)(buf + 0x7c),local_a8,0x80,
              "Digest qop=\"auth\", realm=\"%s\", nonce=\"%lu\"",nonce,uVar3 ^ uVar2 + lVar1);
  if (buf._124_4_ == 0) {
    mg_response_header_add(conn,"WWW-Authenticate",local_a8,-1);
  }
  mg_response_header_send(conn);
  return;
}

Assistant:

static void
send_authorization_request(struct mg_connection *conn, const char *realm)
{
	uint64_t nonce = (uint64_t)(conn->phys_ctx->start_time);
	int trunc = 0;
	char buf[128];

	if (!realm) {
		realm = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	mg_lock_context(conn->phys_ctx);
	nonce += conn->dom_ctx->nonce_count;
	++conn->dom_ctx->nonce_count;
	mg_unlock_context(conn->phys_ctx);

	nonce ^= conn->dom_ctx->auth_nonce_mask;
	conn->must_close = 1;

	/* Create 401 response */
	mg_response_header_start(conn, 401);
	send_no_cache_header(conn);
	send_additional_header(conn);
	mg_response_header_add(conn, "Content-Length", "0", -1);

	/* Content for "WWW-Authenticate" header */
	mg_snprintf(conn,
	            &trunc,
	            buf,
	            sizeof(buf),
	            "Digest qop=\"auth\", realm=\"%s\", "
	            "nonce=\"%" UINT64_FMT "\"",
	            realm,
	            nonce);

	if (!trunc) {
		/* !trunc should always be true */
		mg_response_header_add(conn, "WWW-Authenticate", buf, -1);
	}

	/* Send all headers */
	mg_response_header_send(conn);
}